

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall
OSTEI_VRR_Algorithm_Base::OSTEI_VRR_Algorithm_Base
          (OSTEI_VRR_Algorithm_Base *this,OSTEI_GeneratorInfo *info)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__OSTEI_VRR_Algorithm_Base_00199c50;
  OSTEI_GeneratorInfo::OSTEI_GeneratorInfo((OSTEI_GeneratorInfo *)this,info);
  std::map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>::map
            ((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_> *)
             0x11a6e3);
  std::
  map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
  ::map((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
         *)0x11a6f3);
  std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::map
            ((map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_> *)0x11a703)
  ;
  std::vector<QAM,_std::allocator<QAM>_>::vector((vector<QAM,_std::allocator<QAM>_> *)0x11a713);
  std::
  map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         *)0x11a723);
  std::
  map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         *)0x11a733);
  std::
  map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         *)0x11a743);
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x11a753);
  return;
}

Assistant:

OSTEI_VRR_Algorithm_Base::OSTEI_VRR_Algorithm_Base(const OSTEI_GeneratorInfo & info)
    : info_(info)
{
}